

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticGraphics.c
# Opt level: O0

void plot_statics_and_menu_text(tgestate_t *state)

{
  tgestate_t *state_00;
  long in_RDI;
  screenlocstring_t *slstring;
  uint8_t *screenptr;
  int iters;
  statictileline_t *stline;
  uint8_t *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar1;
  statictileline_t *state_01;
  
  state_01 = static_graphic_defs;
  iVar1 = 0x12;
  do {
    state_00 = (tgestate_t *)(*(long *)(in_RDI + 0x18) + 0x30 + (ulong)state_01->screenloc);
    if ((state_01->flags_and_length & 0x80) == 0) {
      plot_static_tiles_horizontal(state_00,in_stack_ffffffffffffffd8,(statictileline_t *)0x11583d);
    }
    else {
      plot_static_tiles_vertical(state_00,in_stack_ffffffffffffffd8,(statictileline_t *)0x115827);
    }
    state_01 = state_01 + 1;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  iVar1 = 8;
  do {
    screenlocstring_plot
              ((tgestate_t *)state_01,(screenlocstring_t *)CONCAT44(iVar1,in_stack_ffffffffffffffe8)
              );
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void plot_statics_and_menu_text(tgestate_t *state)
{
  /**
   * $F446: Key choice screenlocstrings.
   */
  static const screenlocstring_t key_choice_screenlocstrings[] =
  {
    { 0x008E,  8, "CONTROLS"                },
    { 0x00CD,  8, "0 SELECT"                },
    { 0x080D, 10, "1 KEYBOARD"              },
    { 0x084D, 10, "2 KEMPSTON"              },
    { 0x088D, 10, "3 SINCLAIR"              },
    { 0x08CD,  8, "4 PROTEK"                },
    { 0x1007, 23, "BREAK OR CAPS AND SPACE" },
    { 0x102C, 12, "FOR NEW GAME"            },
  };

  const statictileline_t  *stline;    /* was HL */
  int                      iters;     /* was B */
  uint8_t                 *screenptr; /* was DE */
  const screenlocstring_t *slstring;  /* was HL */

  assert(state != NULL);

  /* Plot statics and menu text. */
  stline = &static_graphic_defs[0];
  iters  = NELEMS(static_graphic_defs);
  do
  {
    screenptr = &state->speccy->screen.pixels[stline->screenloc]; /* Fetch screen address offset. */
    ASSERT_SCREEN_PTR_VALID(screenptr);

    if (stline->flags_and_length & statictileline_VERTICAL)
      plot_static_tiles_vertical(state, screenptr, stline);
    else
      plot_static_tiles_horizontal(state, screenptr, stline);
    stline++;
  }
  while (--iters);

  /* Plot menu text. */
  iters    = NELEMS(key_choice_screenlocstrings);
  slstring = &key_choice_screenlocstrings[0];
  do
    slstring = screenlocstring_plot(state, slstring);
  while (--iters);
}